

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSubSimplexConvexCast.cpp
# Opt level: O3

bool __thiscall
btSubsimplexConvexCast::calcTimeOfImpact
          (btSubsimplexConvexCast *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btVector3 bVar4;
  CastResult *pCVar5;
  bool bVar6;
  int iVar7;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btVector3 hitA;
  btVector3 hitB;
  btVector3 local_230;
  btScalar local_220;
  float local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [8];
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  btVector3 local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  CastResult *local_168;
  btTransform *local_160;
  btVector3 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  btVector3 local_98;
  btVector3 local_88;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  btVector3 local_40;
  
  local_168 = result;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  fVar18 = (fromA->m_origin).m_floats[0];
  _local_1b8 = ZEXT416((uint)fVar18);
  local_c8 = *(undefined8 *)((fromA->m_origin).m_floats + 1);
  uStack_c0 = 0;
  fVar19 = (fromB->m_origin).m_floats[0];
  _local_1e8 = ZEXT416((uint)fVar19);
  local_1c8 = *(undefined8 *)((fromB->m_origin).m_floats + 1);
  uStack_1c0 = 0;
  fVar10 = (fromA->m_basis).m_el[1].m_floats[2];
  local_e8 = *(undefined8 *)(fromA->m_basis).m_el[0].m_floats;
  local_f8 = *(undefined8 *)(fromA->m_basis).m_el[1].m_floats;
  local_a8 = *(undefined8 *)(fromA->m_basis).m_el[2].m_floats;
  fVar19 = ((toA->m_origin).m_floats[0] - fVar18) - ((toB->m_origin).m_floats[0] - fVar19);
  local_178 = ZEXT416((uint)fVar19);
  local_218._0_4_ =
       ((toA->m_origin).m_floats[1] - (float)local_c8) -
       ((toB->m_origin).m_floats[1] - (float)local_1c8);
  fStack_1f4 = ((toA->m_origin).m_floats[2] - (float)((ulong)local_c8 >> 0x20)) -
               ((toB->m_origin).m_floats[2] - (float)((ulong)local_1c8 >> 0x20));
  fVar19 = -fVar19;
  local_188 = ZEXT416((uint)(float)local_218);
  uStack_210 = CONCAT44((float)local_218,(float)local_218);
  uStack_f0 = 0;
  uStack_e0 = 0;
  local_198 = ZEXT416((uint)fStack_1f4);
  local_1f8 = fStack_1f4;
  uStack_1f0 = CONCAT44(fStack_1f4,fStack_1f4);
  uStack_a0 = 0;
  local_230.m_floats[0] =
       (fVar19 * (float)local_e8 - (float)local_f8 * (float)local_218) -
       (float)local_a8 * fStack_1f4;
  local_230.m_floats[1] =
       (fVar19 * (float)((ulong)local_e8 >> 0x20) -
       (float)((ulong)local_f8 >> 0x20) * (float)local_218) -
       (float)((ulong)local_a8 >> 0x20) * fStack_1f4;
  local_d8 = ZEXT416((uint)fVar10);
  fVar18 = (fromA->m_basis).m_el[0].m_floats[2];
  local_108 = ZEXT416((uint)fVar18);
  local_21c = (fromA->m_basis).m_el[2].m_floats[2];
  local_230.m_floats[2] = (fVar19 * fVar18 - fVar10 * (float)local_218) - local_21c * fStack_1f4;
  local_230.m_floats[3] = 0.0;
  local_118 = ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]);
  local_128 = ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[2]);
  local_138 = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  uStack_130 = 0;
  local_148 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  uStack_140 = 0;
  local_b8 = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  uStack_b0 = 0;
  bVar8 = (fromB->m_basis).m_el[2].m_floats[2];
  local_220 = bVar8;
  local_160 = toB;
  local_218._4_4_ = (float)local_218;
  (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[0x10])
            (this->m_convexA,&local_230);
  fVar18 = (float)extraout_XMM0_Qa;
  fVar19 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  uVar1 = *(undefined8 *)(fromA->m_origin).m_floats;
  local_1a8 = (float)uVar1 +
              (fromA->m_basis).m_el[0].m_floats[2] * bVar8 +
              (fromA->m_basis).m_el[0].m_floats[0] * fVar18 +
              (fromA->m_basis).m_el[0].m_floats[1] * fVar19;
  fStack_1a4 = (float)((ulong)uVar1 >> 0x20) +
               (fromA->m_basis).m_el[1].m_floats[2] * bVar8 +
               (fromA->m_basis).m_el[1].m_floats[0] * fVar18 +
               (fromA->m_basis).m_el[1].m_floats[1] * fVar19;
  fStack_1a0 = (fromA->m_basis).m_el[1].m_floats[0] * bVar8 +
               (fromA->m_basis).m_el[0].m_floats[2] * fVar18 +
               (fromA->m_basis).m_el[0].m_floats[3] * fVar19 + 0.0;
  fStack_19c = (fromA->m_basis).m_el[1].m_floats[1] * bVar8 +
               (fromA->m_basis).m_el[0].m_floats[3] * fVar18 +
               (fromA->m_basis).m_el[1].m_floats[0] * fVar19 + 0.0;
  fVar18 = (fromA->m_basis).m_el[2].m_floats[2] * bVar8 +
           (fromA->m_basis).m_el[2].m_floats[0] * fVar18 +
           (fromA->m_basis).m_el[2].m_floats[1] * fVar19 + (fromA->m_origin).m_floats[2];
  _local_208 = ZEXT416((uint)fVar18);
  local_1d8.m_floats[1] = fStack_1a4;
  local_1d8.m_floats[0] = local_1a8;
  local_1d8.m_floats[2] = fVar18;
  local_1d8.m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  uVar2 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  uVar3 = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  fVar18 = (fromB->m_basis).m_el[2].m_floats[2] * (float)local_198._0_4_ +
           (fromB->m_basis).m_el[0].m_floats[2] * (float)local_178._0_4_ +
           (fromB->m_basis).m_el[1].m_floats[2] * (float)local_188._0_4_;
  local_230.m_floats[1] =
       (float)((ulong)uVar3 >> 0x20) * fStack_1f4 +
       (float)local_178._0_4_ * (float)((ulong)uVar1 >> 0x20) +
       (float)((ulong)uVar2 >> 0x20) * local_218._4_4_;
  local_230.m_floats[0] =
       (float)uVar3 * local_1f8 +
       (float)local_178._0_4_ * (float)uVar1 + (float)uVar2 * (float)local_218;
  local_230.m_floats[2] = fVar18;
  local_230.m_floats[3] = 0.0;
  (*(this->m_convexB->super_btCollisionShape)._vptr_btCollisionShape[0x10])
            (this->m_convexB,&local_230);
  fVar19 = (float)extraout_XMM0_Qa_00;
  fVar10 = (float)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uVar1 = *(undefined8 *)(fromB->m_origin).m_floats;
  fVar11 = (fromB->m_basis).m_el[2].m_floats[2] * fVar18 +
           (fromB->m_basis).m_el[2].m_floats[0] * fVar19 +
           (fromB->m_basis).m_el[2].m_floats[1] * fVar10 + (fromB->m_origin).m_floats[2];
  fVar9 = (float)uVar1 +
          (fromB->m_basis).m_el[0].m_floats[2] * fVar18 +
          (fromB->m_basis).m_el[0].m_floats[0] * fVar19 +
          (fromB->m_basis).m_el[0].m_floats[1] * fVar10;
  fVar18 = (float)((ulong)uVar1 >> 0x20) +
           (fromB->m_basis).m_el[1].m_floats[2] * fVar18 +
           (fromB->m_basis).m_el[1].m_floats[0] * fVar19 +
           (fromB->m_basis).m_el[1].m_floats[1] * fVar10;
  fVar16 = local_1a8 - fVar9;
  fVar17 = fStack_1a4 - fVar18;
  local_88.m_floats[1] = fVar18;
  local_88.m_floats[0] = fVar9;
  local_88.m_floats[2] = fVar11;
  local_88.m_floats[3] = 0.0;
  fVar11 = (float)local_208._0_4_ - fVar11;
  local_230.m_floats[1] = fVar17;
  local_230.m_floats[0] = fVar16;
  local_230.m_floats[2] = fVar11;
  local_230.m_floats[3] = 0.0;
  local_218 = 0;
  uStack_210 = 0;
  fVar18 = 0.0;
  bVar8 = 0.0;
  fVar19 = 0.0;
  fVar10 = 0.0;
  if (0.0001 < fVar11 * fVar11 + fVar16 * fVar16 + fVar17 * fVar17) {
    local_1e8._4_4_ = (float)local_1c8;
    fStack_1e0 = local_1c8._4_4_;
    fStack_1dc = (float)local_1b8._0_4_;
    local_1a8 = (float)local_108._0_4_;
    fStack_1a4 = (float)local_d8._0_4_;
    fStack_1a0 = (float)local_108._4_4_;
    fStack_19c = (float)local_d8._4_4_;
    local_1b8._4_4_ = (float)local_f8;
    local_1b8._0_4_ = (float)local_e8;
    uStack_1b0 = local_e8._4_4_;
    uStack_1ac = local_f8._4_4_;
    local_1c8 = CONCAT44(local_f8._4_4_,local_e8._4_4_);
    uStack_1c0 = uStack_e0;
    local_58 = (float)local_118._0_4_;
    fStack_54 = (float)local_128._0_4_;
    uStack_50 = local_118._4_4_;
    uStack_4c = local_128._4_4_;
    local_68 = (float)local_138;
    fStack_64 = (float)local_148;
    fStack_60 = local_138._4_4_;
    fStack_5c = local_148._4_4_;
    local_78 = local_138._4_4_;
    fStack_74 = local_148._4_4_;
    uStack_70 = (undefined4)uStack_130;
    uStack_6c = uStack_130._4_4_;
    iVar7 = -0x21;
    local_218 = 0;
    uStack_210 = 0;
    fVar18 = 0.0;
    bVar8 = 0.0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    do {
      iVar7 = iVar7 + 1;
      if (iVar7 == 0) break;
      local_208._4_4_ = bVar8;
      local_208._0_4_ = fVar18;
      uStack_200 = uVar12;
      uStack_1fc = uVar13;
      fStack_1f4 = fVar10;
      local_1f8 = fVar19;
      uStack_1f0 = CONCAT44(uVar15,uVar14);
      fVar18 = (float)((uint)local_230.m_floats[0] ^ (uint)DAT_001ee270);
      fVar19 = (fVar18 * (float)local_108._0_4_ - (float)local_d8._0_4_ * local_230.m_floats[1]) -
               local_21c * local_230.m_floats[2];
      local_158.m_floats[1] =
           (fVar18 * local_e8._4_4_ - local_230.m_floats[1] * local_f8._4_4_) -
           local_230.m_floats[2] * local_a8._4_4_;
      local_158.m_floats[0] =
           (fVar18 * (float)local_e8 - local_230.m_floats[1] * (float)local_f8) -
           local_230.m_floats[2] * (float)local_a8;
      local_158.m_floats[2] = fVar19;
      local_158.m_floats[3] = 0.0;
      (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[0x10])
                (this->m_convexA,&local_158);
      fVar18 = (float)extraout_XMM0_Qa_01;
      fVar10 = (float)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      local_1d8.m_floats[0] =
           fStack_1dc +
           fVar19 * local_1a8 + fVar18 * (float)local_1b8._0_4_ + fVar10 * (float)local_1c8;
      local_1d8.m_floats[1] =
           (float)local_c8 +
           fVar19 * fStack_1a4 + fVar18 * (float)local_1b8._4_4_ + fVar10 * local_1c8._4_4_;
      local_1d8.m_floats[2] =
           local_c8._4_4_ + fVar19 * local_21c + fVar18 * (float)local_a8 + local_a8._4_4_ * fVar10;
      local_1d8.m_floats[3] = 0.0;
      fVar10 = local_220 * local_230.m_floats[2];
      local_158.m_floats[1] =
           local_230.m_floats[2] * local_b8._4_4_ +
           local_230.m_floats[0] * local_138._4_4_ + local_230.m_floats[1] * local_148._4_4_;
      local_158.m_floats[0] =
           local_230.m_floats[2] * (float)local_b8 +
           local_230.m_floats[0] * (float)local_138 + local_230.m_floats[1] * (float)local_148;
      local_158.m_floats[2] =
           (float)local_118._0_4_ * local_230.m_floats[0] +
           (float)local_128._0_4_ * local_230.m_floats[1] + fVar10;
      local_158.m_floats[3] = 0.0;
      (*(this->m_convexB->super_btCollisionShape)._vptr_btCollisionShape[0x10])
                (this->m_convexB,&local_158);
      bVar4.m_floats = local_230.m_floats;
      fVar18 = (float)extraout_XMM0_Qa_02;
      fVar19 = (float)((ulong)extraout_XMM0_Qa_02 >> 0x20);
      fVar9 = fVar10 * local_58 + fVar18 * local_68 + fVar19 * local_78 + (float)local_1e8._0_4_;
      fVar11 = fVar10 * fStack_54 + fVar18 * fStack_64 + fVar19 * fStack_74 + (float)local_1e8._4_4_
      ;
      fVar18 = fStack_1e0 + fVar10 * local_220 + fVar18 * (float)local_b8 + local_b8._4_4_ * fVar19;
      fVar19 = local_1d8.m_floats[0] - fVar9;
      fVar10 = local_1d8.m_floats[1] - fVar11;
      local_88.m_floats[1] = fVar11;
      local_88.m_floats[0] = fVar9;
      local_88.m_floats[2] = fVar18;
      local_88.m_floats[3] = 0.0;
      fVar18 = local_1d8.m_floats[2] - fVar18;
      local_98.m_floats[1] = fVar10;
      local_98.m_floats[0] = fVar19;
      local_98.m_floats[2] = fVar18;
      local_98.m_floats[3] = 0.0;
      if (1.0 < (float)local_218) goto LAB_00180e91;
      fVar18 = fVar18 * local_230.m_floats[2] +
               fVar10 * local_230.m_floats[1] + local_230.m_floats[0] * fVar19;
      if (0.0 < fVar18) {
        fVar19 = local_230.m_floats[2] * (float)local_198._0_4_ +
                 local_230.m_floats[0] * (float)local_178._0_4_ +
                 local_230.m_floats[1] * (float)local_188._0_4_;
        if (-1.4210855e-14 <= fVar19) goto LAB_00180e91;
        local_218._0_4_ = (float)local_218 - fVar18 / fVar19;
        fVar18 = 1.0 - (float)local_218;
        uVar1 = *(undefined8 *)((fromA->m_origin).m_floats + 1);
        uVar2 = *(undefined8 *)((toA->m_origin).m_floats + 1);
        local_c8 = CONCAT44((float)((ulong)uVar1 >> 0x20) * fVar18 +
                            (float)((ulong)uVar2 >> 0x20) * (float)local_218,
                            (float)uVar1 * fVar18 + (float)uVar2 * (float)local_218);
        uStack_c0 = CONCAT44(fVar18 * 0.0 + (float)local_218 * 0.0,
                             fVar18 * 0.0 + (float)local_218 * 0.0);
        uVar1 = *(undefined8 *)((fromB->m_origin).m_floats + 1);
        uVar2 = *(undefined8 *)((local_160->m_origin).m_floats + 1);
        local_1e8._4_4_ = (float)uVar1 * fVar18 + (float)uVar2 * (float)local_218;
        local_1e8._0_4_ =
             (fromB->m_origin).m_floats[0] * fVar18 +
             (local_160->m_origin).m_floats[0] * (float)local_218;
        fStack_1e0 = (float)((ulong)uVar1 >> 0x20) * fVar18 +
                     (float)((ulong)uVar2 >> 0x20) * (float)local_218;
        fStack_1dc = (fromA->m_origin).m_floats[0] * fVar18 +
                     (toA->m_origin).m_floats[0] * (float)local_218;
        local_1f8 = local_230.m_floats[0];
        fStack_1f4 = local_230.m_floats[1];
        uStack_1f0 = 0;
        local_230.m_floats._8_8_ = bVar4.m_floats._8_8_;
        _uStack_200 = 0;
        local_208._0_4_ = local_230.m_floats[2];
        local_208._4_4_ = local_230.m_floats[3];
      }
      local_230.m_floats = bVar4.m_floats;
      bVar6 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&local_98);
      if (!bVar6) {
        btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&local_98,&local_1d8,&local_88);
      }
      bVar6 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&local_230);
      fVar18 = (float)local_208._0_4_;
      bVar8 = (btScalar)local_208._4_4_;
      fVar19 = local_1f8;
      fVar10 = fStack_1f4;
      if (!bVar6) break;
      uVar12 = uStack_200;
      uVar13 = uStack_1fc;
      uVar14 = (undefined4)uStack_1f0;
      uVar15 = uStack_1f0._4_4_;
    } while (0.0001 < local_230.m_floats[2] * local_230.m_floats[2] +
                      local_230.m_floats[0] * local_230.m_floats[0] +
                      local_230.m_floats[1] * local_230.m_floats[1]);
  }
  pCVar5 = local_168;
  local_168->m_fraction = (float)local_218;
  fVar9 = fVar18 * fVar18 + fVar19 * fVar19 + fVar10 * fVar10;
  if (1.4210855e-14 <= fVar9) {
    fVar9 = 1.0 / SQRT(fVar9);
    fVar18 = fVar18 * fVar9;
    fVar19 = fVar19 * fVar9;
    fVar10 = fVar10 * fVar9;
    (local_168->m_normal).m_floats[0] = fVar19;
    (local_168->m_normal).m_floats[1] = fVar10;
    (local_168->m_normal).m_floats[2] = fVar18;
    (local_168->m_normal).m_floats[3] = bVar8;
  }
  else {
    fVar19 = 0.0;
    fVar10 = 0.0;
    (local_168->m_normal).m_floats[0] = 0.0;
    (local_168->m_normal).m_floats[1] = 0.0;
    (local_168->m_normal).m_floats[2] = 0.0;
    (local_168->m_normal).m_floats[3] = 0.0;
    fVar18 = 0.0;
  }
  if (-local_168->m_allowedPenetration <=
      fVar18 * (float)local_198._0_4_ +
      (float)local_178._0_4_ * fVar19 + (float)local_188._0_4_ * fVar10) {
LAB_00180e91:
    bVar6 = false;
  }
  else {
    btVoronoiSimplexSolver::compute_points(this->m_simplexSolver,&local_158,&local_40);
    *(undefined8 *)(pCVar5->m_hitPoint).m_floats = local_40.m_floats._0_8_;
    *(undefined8 *)((pCVar5->m_hitPoint).m_floats + 2) = local_40.m_floats._8_8_;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool	btSubsimplexConvexCast::calcTimeOfImpact(
		const btTransform& fromA,
		const btTransform& toA,
		const btTransform& fromB,
		const btTransform& toB,
		CastResult& result)
{

	m_simplexSolver->reset();

	btVector3 linVelA,linVelB;
	linVelA = toA.getOrigin()-fromA.getOrigin();
	linVelB = toB.getOrigin()-fromB.getOrigin();

	btScalar lambda = btScalar(0.);

	btTransform interpolatedTransA = fromA;
	btTransform interpolatedTransB = fromB;

	///take relative motion
	btVector3 r = (linVelA-linVelB);
	btVector3 v;
	
	btVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r*fromA.getBasis()));
	btVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r*fromB.getBasis()));
	v = supVertexA-supVertexB;
	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	
	btVector3 c;

	


	btScalar dist2 = v.length2();
#ifdef BT_USE_DOUBLE_PRECISION
	btScalar epsilon = btScalar(0.0001);
#else
	btScalar epsilon = btScalar(0.0001);
#endif //BT_USE_DOUBLE_PRECISION
	btVector3	w,p;
	btScalar VdotR;
	
	while ( (dist2 > epsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v*interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v*interpolatedTransB.getBasis()));
		w = supVertexA-supVertexB;

		btScalar VdotW = v.dot(w);

		if (lambda > btScalar(1.0))
		{
			return false;
		}

		if ( VdotW > btScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON*SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(),toA.getOrigin(),lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(),toB.getOrigin(),lambda);
				//m_simplexSolver->reset();
				//check next line
				 w = supVertexA-supVertexB;
				
				n = v;
				
			}
		} 
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex( w, supVertexA , supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();
			
			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		} else
		{
			dist2 = btScalar(0.);
		} 
	}

	//int numiter = MAX_ITERATIONS - maxIter;
//	printf("number of iterations: %d", numiter);
	
	//don't report a time of impact when moving 'away' from the hitnormal
	

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON*SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = btVector3(btScalar(0.0), btScalar(0.0), btScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r)>=-result.m_allowedPenetration)
		return false;

	btVector3 hitA,hitB;
	m_simplexSolver->compute_points(hitA,hitB);
	result.m_hitPoint=hitB;
	return true;
}